

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O0

CommandLineArguments * __thiscall
cmsys::Encoding::CommandLineArguments::operator=
          (CommandLineArguments *this,CommandLineArguments *other)

{
  size_type sVar1;
  reference ppcVar2;
  const_reference ppcVar3;
  char *local_40;
  ulong local_20;
  size_t i;
  CommandLineArguments *other_local;
  CommandLineArguments *this_local;
  
  if (this != other) {
    for (local_20 = 0; sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(&this->argv_),
        local_20 < sVar1; local_20 = local_20 + 1) {
      ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&this->argv_,local_20);
      free(*ppcVar2);
    }
    sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(&other->argv_);
    std::vector<char_*,_std::allocator<char_*>_>::resize(&this->argv_,sVar1);
    for (local_20 = 0; sVar1 = std::vector<char_*,_std::allocator<char_*>_>::size(&this->argv_),
        local_20 < sVar1; local_20 = local_20 + 1) {
      ppcVar3 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&other->argv_,local_20);
      if (*ppcVar3 == (value_type)0x0) {
        local_40 = (char *)0x0;
      }
      else {
        ppcVar3 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&other->argv_,local_20);
        local_40 = strdup(*ppcVar3);
      }
      ppcVar2 = std::vector<char_*,_std::allocator<char_*>_>::operator[](&this->argv_,local_20);
      *ppcVar2 = local_40;
    }
  }
  return this;
}

Assistant:

Encoding::CommandLineArguments& Encoding::CommandLineArguments::operator=(
  const CommandLineArguments& other)
{
  if (this != &other) {
    size_t i;
    for (i = 0; i < this->argv_.size(); i++) {
      free(this->argv_[i]);
    }

    this->argv_.resize(other.argv_.size());
    for (i = 0; i < this->argv_.size(); i++) {
      this->argv_[i] = other.argv_[i] ? strdup(other.argv_[i]) : nullptr;
    }
  }

  return *this;
}